

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O0

string * libwebm::GetTempFileName_abi_cxx11_(void)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  string *in_RDI;
  char *local_90;
  allocator local_76;
  undefined1 local_75;
  int local_74;
  char *pcStack_70;
  int fd;
  char *temp_file_name_template;
  allocator local_51;
  string local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [8];
  string temp_file_name_template_str;
  string *temp_file_name;
  
  pcVar1 = getenv("TEST_TMPDIR");
  if (pcVar1 == (char *)0x0) {
    local_90 = ".";
  }
  else {
    local_90 = getenv("TEST_TMPDIR");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,local_90,&local_51);
  std::operator+(local_30,(char *)local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  lVar2 = std::__cxx11::string::length();
  pcVar1 = (char *)operator_new__(lVar2 + 1);
  pcStack_70 = pcVar1;
  lVar2 = std::__cxx11::string::length();
  memset(pcVar1,0,lVar2 + 1);
  pcVar1 = pcStack_70;
  uVar3 = std::__cxx11::string::length();
  std::__cxx11::string::copy((char *)local_30,(ulong)pcVar1,uVar3);
  local_74 = mkstemp(pcStack_70);
  pcVar1 = pcStack_70;
  local_75 = 0;
  if (local_74 == -1) {
    std::__cxx11::string::string(in_RDI);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,pcVar1,&local_76);
    std::allocator<char>::~allocator((allocator<char> *)&local_76);
  }
  if (pcStack_70 != (char *)0x0) {
    operator_delete__(pcStack_70);
  }
  if (local_74 != -1) {
    close(local_74);
  }
  local_75 = 1;
  std::__cxx11::string::~string((string *)local_30);
  return in_RDI;
}

Assistant:

std::string GetTempFileName() {
#if !defined _MSC_VER && !defined __MINGW32__
  std::string temp_file_name_template_str =
      std::string(std::getenv("TEST_TMPDIR") ? std::getenv("TEST_TMPDIR")
                                             : ".") +
      "/libwebm_temp.XXXXXX";
  char* temp_file_name_template =
      new char[temp_file_name_template_str.length() + 1];
  memset(temp_file_name_template, 0, temp_file_name_template_str.length() + 1);
  temp_file_name_template_str.copy(temp_file_name_template,
                                   temp_file_name_template_str.length(), 0);
  int fd = mkstemp(temp_file_name_template);
  std::string temp_file_name =
      (fd != -1) ? std::string(temp_file_name_template) : std::string();
  delete[] temp_file_name_template;
  if (fd != -1) {
    close(fd);
  }
  return temp_file_name;
#else
  char tmp_file_name[_MAX_PATH];
#if defined _MSC_VER || defined MINGW_HAS_SECURE_API
  errno_t err = tmpnam_s(tmp_file_name);
#else
  char* fname_pointer = tmpnam(tmp_file_name);
  int err = (fname_pointer == &tmp_file_name[0]) ? 0 : -1;
#endif
  if (err == 0) {
    return std::string(tmp_file_name);
  }
  return std::string();
#endif
}